

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

QPoint __thiscall QIconModeViewBase::draggedItemsDelta(QIconModeViewBase *this)

{
  long lVar1;
  Movement MVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QIconModeViewBase *in_RDI;
  long in_FS_OFFSET;
  QPoint snapdelta;
  QCommonListViewBase *in_stack_ffffffffffffff68;
  QCommonListViewBase *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QIconModeViewBase *this_00;
  QPoint local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MVar2 = QCommonListViewBase::movement(&in_RDI->super_QCommonListViewBase);
  if (MVar2 == Snap) {
    QCommonListViewBase::offset(in_stack_ffffffffffffff68);
    iVar3 = QPoint::x((QPoint *)0x886237);
    QCommonListViewBase::gridSize(in_stack_ffffffffffffff68);
    iVar4 = QSize::width((QSize *)0x886254);
    iVar4 = iVar3 % iVar4;
    QCommonListViewBase::offset(in_stack_ffffffffffffff68);
    iVar5 = QPoint::y((QPoint *)0x88627a);
    QCommonListViewBase::gridSize(in_stack_ffffffffffffff68);
    QSize::height((QSize *)0x886297);
    QPoint::QPoint((QPoint *)in_stack_ffffffffffffff70,
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68);
    ::operator+((QPoint *)CONCAT44(iVar5,iVar4),(QPoint *)CONCAT44(iVar3,in_stack_ffffffffffffff78))
    ;
    snapToGrid(this_00,(QPoint *)in_RDI);
    QCommonListViewBase::pressedPosition(in_stack_ffffffffffffff70);
    snapToGrid(this_00,(QPoint *)in_RDI);
    ::operator-((QPoint *)CONCAT44(iVar5,iVar4),(QPoint *)CONCAT44(iVar3,in_stack_ffffffffffffff78))
    ;
    local_68 = ::operator-((QPoint *)CONCAT44(iVar5,iVar4),
                           (QPoint *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
  }
  else {
    QCommonListViewBase::pressedPosition((QCommonListViewBase *)&in_RDI->draggedItemsPos);
    local_68 = ::operator-((QPoint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (QPoint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QIconModeViewBase::draggedItemsDelta() const
{
    if (movement() == QListView::Snap) {
        QPoint snapdelta = QPoint((offset().x() % gridSize().width()),
                                  (offset().y() % gridSize().height()));
        return snapToGrid(draggedItemsPos + snapdelta) - snapToGrid(pressedPosition()) - snapdelta;
    }
    return draggedItemsPos - pressedPosition();
}